

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O2

Scale * __thiscall
icu_63::number::Scale::byDecimal(Scale *__return_storage_ptr__,Scale *this,StringPiece multiplicand)

{
  LocalPointer<icu_63::number::impl::DecNum> arbitraryToAdopt;
  StringPiece str;
  UErrorCode localError;
  LocalPointer<icu_63::number::impl::DecNum> decnum;
  
  str.length_ = multiplicand.ptr_._0_4_;
  localError = U_ZERO_ERROR;
  decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr =
       (LocalPointerBase<icu_63::number::impl::DecNum>)
       UMemory::operator_new((UMemory *)0x60,(size_t)this);
  if (decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr == (DecNum *)0x0) {
    localError = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    impl::DecNum::DecNum((DecNum *)decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr);
    str.ptr_ = (char *)this;
    str._12_4_ = 0;
    impl::DecNum::setTo((DecNum *)decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr,
                        str,&localError);
    arbitraryToAdopt.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr =
         decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr;
    if (localError < U_ILLEGAL_ARGUMENT_ERROR) {
      decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr =
           (LocalPointerBase<icu_63::number::impl::DecNum>)(DecNum *)0x0;
      Scale(__return_storage_ptr__,0,
            (DecNum *)arbitraryToAdopt.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr);
      goto LAB_0025c748;
    }
  }
  __return_storage_ptr__->fMagnitude = 0;
  __return_storage_ptr__->fArbitrary = (DecNum *)0x0;
  __return_storage_ptr__->fError = localError;
LAB_0025c748:
  LocalPointer<icu_63::number::impl::DecNum>::~LocalPointer(&decnum);
  return __return_storage_ptr__;
}

Assistant:

Scale Scale::byDecimal(StringPiece multiplicand) {
    UErrorCode localError = U_ZERO_ERROR;
    LocalPointer<DecNum> decnum(new DecNum(), localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    decnum->setTo(multiplicand, localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    return {0, decnum.orphan()};
}